

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventThread.cpp
# Opt level: O0

void __thiscall EventThread::threadMain(EventThread *this)

{
  Event *ev_00;
  bool local_19;
  bool done;
  Event *ev;
  EventThread *this_local;
  
  local_19 = false;
  while (((local_19 ^ 0xffU) & 1) != 0) {
    ev_00 = EventQueue::WaitEvent(&(this->super_EventDispatcher).mQueue,0);
    if (ev_00 == (Event *)0x0) {
      jh_log_print(1,"void EventThread::threadMain()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventThread.cpp"
                   ,0x42,"got a null event\n");
    }
    local_19 = EventDispatcher::handleEvent(&this->super_EventDispatcher,ev_00);
  }
  return;
}

Assistant:

void EventThread::threadMain()
{
	TRACE_BEGIN( LOG_LVL_NOTICE );
	Event *ev = NULL;
	bool done = false;
	
	while( !done )
	{
		LOG_INFO( "Waiting Event" );

		ev = mQueue.WaitEvent();

		LOG_NOISE( "Got Event" );
		
		if ( ev == NULL )
			LOG_ERR_FATAL( "got a null event\n" );
		
		// not needed, at this time.
		//AutoLock a( mLock );
		
		done = handleEvent( ev );
	}
}